

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_sl_Singleton.h
# Opt level: O0

void __thiscall
axl::sl::ConstructSingleton<axl::sys::lnx::libudev::UdevLib>::operator()
          (ConstructSingleton<axl::sys::lnx::libudev::UdevLib> *this,void *p)

{
  Module *this_00;
  UdevLib *p_00;
  Module *in_RSI;
  Ptr<axl::g::Finalizer> *in_stack_ffffffffffffffd0;
  Ptr<axl::g::Finalizer> *in_stack_ffffffffffffffe8;
  
  sys::lnx::libudev::UdevLib::UdevLib((UdevLib *)this);
  this_00 = g::getModule();
  p_00 = (UdevLib *)mem::allocate(0x1435cc);
  DestructSingleton<axl::sys::lnx::libudev::UdevLib>::DestructSingleton
            ((DestructSingleton<axl::sys::lnx::libudev::UdevLib> *)this_00,p_00);
  rc::primeRefCount<axl::sl::DestructSingleton<axl::sys::lnx::libudev::UdevLib>>
            ((DestructSingleton<axl::sys::lnx::libudev::UdevLib> *)this_00,(FreeFunc *)p_00);
  rc::Ptr<axl::g::Finalizer>::Ptr<axl::sl::DestructSingleton<axl::sys::lnx::libudev::UdevLib>>
            (in_stack_ffffffffffffffd0,
             (DestructSingleton<axl::sys::lnx::libudev::UdevLib> *)&stack0xffffffffffffffe0);
  g::Module::addFinalizer(in_RSI,in_stack_ffffffffffffffe8);
  rc::Ptr<axl::g::Finalizer>::~Ptr((Ptr<axl::g::Finalizer> *)0x14361a);
  return;
}

Assistant:

void
	operator () (void* p) {
		new(p)T;
		g::getModule()->addFinalizer(AXL_RC_NEW_ARGS(Destruct, ((T*)p)));
	}